

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall QGraphicsViewPrivate::processPendingUpdates(QGraphicsViewPrivate *this)

{
  long lVar1;
  bool bVar2;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QWidget *in_stack_ffffffffffffffc8;
  QWidget *this_00;
  QRegion in_stack_ffffffffffffffe0;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa35ba1);
  if (bVar2) {
    if ((*(uint *)&in_RDI[0x13].field_0x8 >> 0xc & 1) == 0) {
      if (*(int *)((long)&in_RDI[0x1c].data + 4) == 4) {
        QWidget::update(this_00,(QRect *)in_RDI);
      }
      else {
        QWidget::update((QWidget *)in_stack_ffffffffffffffe0.d,(QRegion *)this_00);
      }
    }
    else {
      QWidget::update(in_stack_ffffffffffffffc8);
    }
    QRect::QRect((QRect *)in_RDI);
    *(undefined8 *)&in_RDI[0x21].field_0x8 = local_18;
    *(undefined8 *)&in_RDI[0x21].super_QPaintDevice = local_10;
    QRegion::QRegion((QRegion *)&stack0xffffffffffffffe0);
    QRegion::operator=((QRegion *)in_RDI,(QRegion *)in_stack_ffffffffffffffc8);
    QRegion::~QRegion((QRegion *)&stack0xffffffffffffffe0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsViewPrivate::processPendingUpdates()
{
    if (!scene)
        return;

    if (fullUpdatePending) {
        viewport->update();
    } else if (viewportUpdateMode == QGraphicsView::BoundingRectViewportUpdate) {
        viewport->update(dirtyBoundingRect);
    } else {
        viewport->update(dirtyRegion); // Already adjusted in updateRect/Region.
    }

    dirtyBoundingRect = QRect();
    dirtyRegion = QRegion();
}